

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

int __thiscall HttpConn::init(HttpConn *this,EVP_PKEY_CTX *ctx)

{
  EventLoop *this_00;
  int extraout_EAX;
  element_type *peVar1;
  int in_ECX;
  string *in_RDX;
  ChannelPtr *this_01;
  shared_ptr<Channel> local_38;
  int local_24;
  int fd_local;
  string *from_local;
  EventLoop *loop_local;
  HttpConn *this_local;
  
  this->connStatus_ = Connected;
  this->fd_ = in_ECX;
  local_24 = in_ECX;
  from_local = (string *)ctx;
  loop_local = (EventLoop *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->outputHeaders_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->headers_);
  this_01 = &this->channel_;
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_01);
  Channel::reset(peVar1,(EventLoop *)from_local,local_24);
  this->loop_ = (EventLoop *)from_local;
  EventLoop::addConnCnt(this->loop_);
  std::__cxx11::string::operator=((string *)&this->from_,in_RDX);
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_01);
  Channel::setEvent(peVar1,-0x7ffffffb);
  this_00 = this->loop_;
  std::shared_ptr<Channel>::shared_ptr(&local_38,this_01);
  EventLoop::addChannel(this_00,&local_38);
  std::shared_ptr<Channel>::~shared_ptr(&local_38);
  return extraout_EAX;
}

Assistant:

void HttpConn::init(EventLoop* loop, std::string from, int fd) {
    connStatus_ = Connected;
    fd_ = fd;
    outputHeaders_.clear();
    headers_.clear();
    channel_->reset(loop, fd);
    loop_ = loop;
    loop_->addConnCnt();
    from_ = std::move(from);
    channel_->setEvent(defautlEvent);
    loop_->addChannel(channel_);
}